

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

DateTime * FIX::DateTime::fromTm(DateTime *__return_storage_ptr__,tm *tm,int fraction,int precision)

{
  int nanos_00;
  int date;
  int64_t time;
  int nanos;
  int precision_local;
  int fraction_local;
  tm *tm_local;
  
  nanos_00 = convertToNanos(fraction,precision);
  date = julianDate(tm->tm_year + 0x76c,tm->tm_mon + 1,tm->tm_mday);
  time = makeHMS(tm->tm_hour,tm->tm_min,tm->tm_sec,nanos_00);
  DateTime(__return_storage_ptr__,date,time);
  return __return_storage_ptr__;
}

Assistant:

static DateTime fromTm( const tm& tm, int fraction, int precision )
  {
    int nanos = convertToNanos(fraction, precision);
    return DateTime ( julianDate(tm.tm_year + 1900, tm.tm_mon + 1,
                                 tm.tm_mday),
                     makeHMS(tm.tm_hour, tm.tm_min, tm.tm_sec, nanos) );
  }